

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32FloatWaveGenerator.cpp
# Opt level: O0

float __thiscall
MT32Emu::LA32FloatWaveGenerator::generateNextSample
          (LA32FloatWaveGenerator *this,Bit32u ampVal,Bit16u pitch,Bit32u cutoffRampVal)

{
  bool bVar1;
  uint position;
  Tables *pTVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  float local_70;
  float syncSine;
  float resAmpFade;
  float resAmpFadeLog2;
  float resAmpDecayFactor;
  float resSample;
  float hLen;
  float pulseLen;
  float relWavePos;
  float cosineLen;
  float waveLen;
  float cutoffVal;
  float resAmp;
  float newPCMPosition;
  float firstSample;
  float positionDelta;
  int intPCMPosition;
  int len;
  float freq;
  float amp;
  float sample;
  Bit32u cutoffRampVal_local;
  Bit16u pitch_local;
  Bit32u ampVal_local;
  LA32FloatWaveGenerator *this_local;
  
  if ((this->active & 1U) == 0) {
    this_local._4_4_ = 0.0;
  }
  else {
    fVar3 = EXP2F(((float)ampVal / -1024.0) / 4096.0);
    fVar4 = EXP2F((float)pitch / 4096.0 - 16.0);
    fVar4 = fVar4 * 32000.0;
    bVar1 = isPCMWave(this);
    if (bVar1) {
      position = (uint)this->pcmPosition;
      if (((int)this->pcmWaveLength <= (int)position) && ((this->pcmWaveLooped & 1U) == 0)) {
        deactivate(this);
        return 0.0;
      }
      freq = getPCMSample(this,position);
      if ((this->pcmWaveInterpolated & 1U) != 0) {
        fVar5 = getPCMSample(this,position + 1);
        freq = (fVar5 - freq) * (this->pcmPosition - (float)(int)position) + freq;
      }
      cutoffVal = this->pcmPosition + (fVar4 * 2048.0) / 32000.0;
      if ((this->pcmWaveLooped & 1U) != 0) {
        dVar6 = fmod((double)cutoffVal,(double)this->pcmWaveLength);
        cutoffVal = (float)dVar6;
      }
      this->pcmPosition = cutoffVal;
    }
    else {
      this->wavePos = this->wavePos * (this->lastFreq / fVar4);
      this->lastFreq = fVar4;
      waveLen = EXP2F((float)(int)(0x20 - (uint)this->resonance) * -0.25 + 1.0);
      cosineLen = (float)cutoffRampVal / 262144.0;
      if (240.0 < cosineLen) {
        cosineLen = 240.0;
      }
      fVar4 = 32000.0 / fVar4;
      pulseLen = fVar4 * 0.5;
      if (128.0 < cosineLen) {
        fVar5 = EXP2F((cosineLen - 128.0) / -16.0);
        pulseLen = fVar5 * pulseLen;
      }
      hLen = pulseLen * 0.5 + this->wavePos;
      if (fVar4 < hLen) {
        hLen = hLen - fVar4;
      }
      resSample = 0.5;
      if (0x80 < this->pulseWidth) {
        resSample = EXP2F((float)(int)(0x40 - (uint)this->pulseWidth) / 64.0);
      }
      resAmpDecayFactor = fVar4 * resSample - pulseLen;
      if (resAmpDecayFactor < 0.0) {
        resAmpDecayFactor = 0.0;
      }
      if ((128.0 <= cosineLen) && (cosineLen < 144.0)) {
        dVar6 = sin((double)(((cosineLen - 128.0) * 3.1415927) / 32.0));
        waveLen = (float)((double)waveLen * dVar6);
      }
      if (pulseLen <= hLen) {
        if (pulseLen + resAmpDecayFactor <= hLen) {
          if (pulseLen + pulseLen + resAmpDecayFactor <= hLen) {
            freq = -1.0;
          }
          else {
            dVar6 = cos((double)(((hLen - (pulseLen + resAmpDecayFactor)) * 3.1415927) / pulseLen));
            freq = (float)dVar6;
          }
        }
        else {
          freq = 1.0;
        }
      }
      else {
        dVar6 = cos((double)((hLen * 3.1415927) / pulseLen));
        freq = (float)-dVar6;
      }
      if (128.0 <= cosineLen) {
        resAmpFadeLog2 = 1.0;
        pTVar2 = Tables::getInstance();
        resAmpFade = (float)pTVar2->resAmpDecayFactor[this->resonance >> 2];
        hLen = this->wavePos;
        if (pulseLen + resAmpDecayFactor <= hLen) {
          resAmpFadeLog2 = -1.0;
          hLen = hLen - (pulseLen + resAmpDecayFactor);
          resAmpFade = resAmpFade + 0.25;
        }
        dVar6 = sin((double)((hLen * 3.1415927) / pulseLen));
        local_70 = EXP2F(resAmpFade * -0.125 * (hLen / pulseLen));
        hLen = this->wavePos;
        if (this->wavePos < pulseLen * -0.5 + fVar4) {
          if (pulseLen * 0.5 + resAmpDecayFactor <= this->wavePos) {
            hLen = hLen - (pulseLen + resAmpDecayFactor);
          }
        }
        else {
          hLen = hLen - fVar4;
        }
        if (hLen < pulseLen * 0.5) {
          dVar7 = sin((double)((hLen * 3.1415927) / pulseLen));
          fVar5 = (float)dVar7;
          if (hLen < 0.0) {
            fVar5 = fVar5 * fVar5;
          }
          local_70 = fVar5 * local_70;
        }
        freq = (float)((double)resAmpFadeLog2 * dVar6) * waveLen * local_70 + freq;
      }
      else {
        fVar5 = EXP2F((128.0 - cosineLen) * -0.125);
        freq = fVar5 * freq;
      }
      if ((this->sawtoothWaveform & 1U) != 0) {
        dVar6 = cos((double)((this->wavePos * 6.2831855) / fVar4));
        freq = (float)((double)freq * dVar6);
      }
      this->wavePos = this->wavePos + 1.0;
      if (fVar4 < this->wavePos) {
        this->wavePos = this->wavePos - fVar4;
      }
    }
    this_local._4_4_ = fVar3 * freq;
  }
  return this_local._4_4_;
}

Assistant:

float LA32FloatWaveGenerator::generateNextSample(const Bit32u ampVal, const Bit16u pitch, const Bit32u cutoffRampVal) {
	if (!active) {
		return 0.0f;
	}

	float sample = 0.0f;

	// SEMI-CONFIRMED: From sample analysis:
	// (1) Tested with a single partial playing PCM wave 77 with pitchCoarse 36 and no keyfollow, velocity follow, etc.
	// This gives results within +/- 2 at the output (before any DAC bitshifting)
	// when sustaining at levels 156 - 255 with no modifiers.
	// (2) Tested with a special square wave partial (internal capture ID tva5) at TVA envelope levels 155-255.
	// This gives deltas between -1 and 0 compared to the real output. Note that this special partial only produces
	// positive amps, so negative still needs to be explored, as well as lower levels.
	//
	// Also still partially unconfirmed is the behaviour when ramping between levels, as well as the timing.

	float amp = EXP2F(ampVal / -1024.0f / 4096.0f);
	float freq = EXP2F(pitch / 4096.0f - 16.0f) * SAMPLE_RATE;

	if (isPCMWave()) {
		// Render PCM waveform
		int len = pcmWaveLength;
		int intPCMPosition = int(pcmPosition);
		if (intPCMPosition >= len && !pcmWaveLooped) {
			// We're now past the end of a non-looping PCM waveform so it's time to die.
			deactivate();
			return 0.0f;
		}
		float positionDelta = freq * 2048.0f / SAMPLE_RATE;

		// Linear interpolation
		float firstSample = getPCMSample(intPCMPosition);
		// We observe that for partial structures with ring modulation the interpolation is not applied to the slave PCM partial.
		// It's assumed that the multiplication circuitry intended to perform the interpolation on the slave PCM partial
		// is borrowed by the ring modulation circuit (or the LA32 chip has a similar lack of resources assigned to each partial pair).
		if (pcmWaveInterpolated) {
			sample = firstSample + (getPCMSample(intPCMPosition + 1) - firstSample) * (pcmPosition - intPCMPosition);
		} else {
			sample = firstSample;
		}

		float newPCMPosition = pcmPosition + positionDelta;
		if (pcmWaveLooped) {
			newPCMPosition = fmod(newPCMPosition, float(pcmWaveLength));
		}
		pcmPosition = newPCMPosition;
	} else {
		// Render synthesised waveform
		wavePos *= lastFreq / freq;
		lastFreq = freq;

		float resAmp = EXP2F(1.0f - (32 - resonance) / 4.0f);
		{
			//static const float resAmpFactor = EXP2F(-7);
			//resAmp = EXP2I(resonance << 10) * resAmpFactor;
		}

		// The cutoffModifier may not be supposed to be directly added to the cutoff -
		// it may for example need to be multiplied in some way.
		// The 240 cutoffVal limit was determined via sample analysis (internal Munt capture IDs: glop3, glop4).
		// More research is needed to be sure that this is correct, however.
		float cutoffVal = cutoffRampVal / 262144.0f;
		if (cutoffVal > MAX_CUTOFF_VALUE) {
			cutoffVal = MAX_CUTOFF_VALUE;
		}

		// Wave length in samples
		float waveLen = SAMPLE_RATE / freq;

		// Init cosineLen
		float cosineLen = 0.5f * waveLen;
		if (cutoffVal > MIDDLE_CUTOFF_VALUE) {
			cosineLen *= EXP2F((cutoffVal - MIDDLE_CUTOFF_VALUE) / -16.0f); // found from sample analysis
		}

		// Start playing in center of first cosine segment
		// relWavePos is shifted by a half of cosineLen
		float relWavePos = wavePos + 0.5f * cosineLen;
		if (relWavePos > waveLen) {
			relWavePos -= waveLen;
		}

		// Ratio of positive segment to wave length
		float pulseLen = 0.5f;
		if (pulseWidth > 128) {
			pulseLen = EXP2F((64 - pulseWidth) / 64.0f);
			//static const float pulseLenFactor = EXP2F(-192 / 64);
			//pulseLen = EXP2I((256 - pulseWidthVal) << 6) * pulseLenFactor;
		}
		pulseLen *= waveLen;

		float hLen = pulseLen - cosineLen;

		// Ignore pulsewidths too high for given freq
		if (hLen < 0.0f) {
			hLen = 0.0f;
		}

		// Correct resAmp for cutoff in range 50..66
		if ((cutoffVal >= MIDDLE_CUTOFF_VALUE) && (cutoffVal < RESONANCE_DECAY_THRESHOLD_CUTOFF_VALUE)) {
			resAmp *= sin(FLOAT_PI * (cutoffVal - MIDDLE_CUTOFF_VALUE) / 32.0f);
		}

		// Produce filtered square wave with 2 cosine waves on slopes

		// 1st cosine segment
		if (relWavePos < cosineLen) {
			sample = -cos(FLOAT_PI * relWavePos / cosineLen);
		} else

		// high linear segment
		if (relWavePos < (cosineLen + hLen)) {
			sample = 1.f;
		} else

		// 2nd cosine segment
		if (relWavePos < (2 * cosineLen + hLen)) {
			sample = cos(FLOAT_PI * (relWavePos - (cosineLen + hLen)) / cosineLen);
		} else {

		// low linear segment
			sample = -1.f;
		}

		if (cutoffVal < MIDDLE_CUTOFF_VALUE) {

			// Attenuate samples below cutoff 50
			// Found by sample analysis
			sample *= EXP2F(-0.125f * (MIDDLE_CUTOFF_VALUE - cutoffVal));
		} else {

			// Add resonance sine. Effective for cutoff > 50 only
			float resSample = 1.0f;

			// Resonance decay speed factor
			float resAmpDecayFactor = Tables::getInstance().resAmpDecayFactor[resonance >> 2];

			// Now relWavePos counts from the middle of first cosine
			relWavePos = wavePos;

			// negative segments
			if (!(relWavePos < (cosineLen + hLen))) {
				resSample = -resSample;
				relWavePos -= cosineLen + hLen;

				// From the digital captures, the decaying speed of the resonance sine is found a bit different for the positive and the negative segments
				resAmpDecayFactor += 0.25f;
			}

			// Resonance sine WG
			resSample *= sin(FLOAT_PI * relWavePos / cosineLen);

			// Resonance sine amp
			float resAmpFadeLog2 = -0.125f * resAmpDecayFactor * (relWavePos / cosineLen); // seems to be exact
			float resAmpFade = EXP2F(resAmpFadeLog2);

			// Now relWavePos set negative to the left from center of any cosine
			relWavePos = wavePos;

			// negative segment
			if (!(wavePos < (waveLen - 0.5f * cosineLen))) {
				relWavePos -= waveLen;
			} else

			// positive segment
			if (!(wavePos < (hLen + 0.5f * cosineLen))) {
				relWavePos -= cosineLen + hLen;
			}

			// To ensure the output wave has no breaks, two different windows are applied to the beginning and the ending of the resonance sine segment
			if (relWavePos < 0.5f * cosineLen) {
				float syncSine = sin(FLOAT_PI * relWavePos / cosineLen);
				if (relWavePos < 0.0f) {
					// The window is synchronous square sine here
					resAmpFade *= syncSine * syncSine;
				} else {
					// The window is synchronous sine here
					resAmpFade *= syncSine;
				}
			}

			sample += resSample * resAmp * resAmpFade;
		}

		// sawtooth waves
		if (sawtoothWaveform) {
			sample *= cos(FLOAT_2PI * wavePos / waveLen);
		}

		wavePos++;

		// wavePos isn't supposed to be > waveLen
		if (wavePos > waveLen) {
			wavePos -= waveLen;
		}
	}

	// Multiply sample with current TVA value
	sample *= amp;
	return sample;
}